

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

void __thiscall QApplicationPrivate::notifyLayoutDirectionChange(QApplicationPrivate *this)

{
  QWidget *this_00;
  long lVar1;
  long lVar2;
  undefined1 *puVar3;
  long in_FS_OFFSET;
  anon_class_8_1_54a39814_for__M_pred local_88;
  undefined1 *puStack_80;
  QList<QWindow_*> local_78;
  QArrayData *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  QWindow *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QApplication::topLevelWidgets();
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (QWindow **)&DAT_aaaaaaaaaaaaaaaa;
  QGuiApplication::topLevelWindows();
  puVar3 = puStack_50;
  if (local_48 != (undefined1 *)0x0) {
    lVar2 = (long)local_48 << 3;
    lVar1 = 0;
    do {
      this_00 = *(QWidget **)(puVar3 + lVar1);
      local_40 = QWidget::windowHandle(this_00);
      local_88.t = &local_40;
      QtPrivate::
      sequential_erase_if<QList<QWindow*>,QtPrivate::sequential_erase<QList<QWindow*>,QWindow*>(QList<QWindow*>&,QWindow*const&)::_lambda(auto:1_const&)_1_>
                (&local_78,&local_88);
      local_88.t = (QWindow **)&DAT_aaaaaaaaaaaaaaaa;
      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_88,ApplicationLayoutDirectionChange);
      QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_88);
      QEvent::~QEvent((QEvent *)&local_88);
      lVar1 = lVar1 + 8;
    } while (lVar2 != lVar1);
  }
  if ((undefined1 *)local_78.d.size != (undefined1 *)0x0) {
    puVar3 = (undefined1 *)0x0;
    do {
      local_88.t = (QWindow **)&DAT_aaaaaaaaaaaaaaaa;
      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_88,ApplicationLayoutDirectionChange);
      QCoreApplication::sendEvent((QObject *)local_78.d.ptr[(long)puVar3],(QEvent *)&local_88);
      QEvent::~QEvent((QEvent *)&local_88);
      puVar3 = puVar3 + 1;
    } while (puVar3 < (ulong)local_78.d.size);
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QApplicationPrivate::notifyLayoutDirectionChange()
{
    const QWidgetList list = QApplication::topLevelWidgets();
    QWindowList windowList = QGuiApplication::topLevelWindows();

    // send to all top-level QWidgets
    for (auto *w : list) {
        windowList.removeAll(w->windowHandle());
        QEvent ev(QEvent::ApplicationLayoutDirectionChange);
        QCoreApplication::sendEvent(w, &ev);
    }

    // in case there are any plain QWindows in this QApplication-using
    // application, also send the notification to them
    for (int i = 0; i < windowList.size(); ++i) {
        QEvent ev(QEvent::ApplicationLayoutDirectionChange);
        QCoreApplication::sendEvent(windowList.at(i), &ev);
    }
}